

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O1

void FOOLElimination::reportProcessed(string *inputRepr,string *outputRepr)

{
  size_t __n;
  int iVar1;
  ostream *poVar2;
  
  __n = inputRepr->_M_string_length;
  if (__n == outputRepr->_M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((inputRepr->_M_dataplus)._M_p,(outputRepr->_M_dataplus)._M_p,__n);
      if (iVar1 != 0) goto LAB_006f28e1;
    }
    return;
  }
LAB_006f28e1:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[PP] FOOL in:  ",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(inputRepr->_M_dataplus)._M_p,
                      inputRepr->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[PP] FOOL out: ",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(outputRepr->_M_dataplus)._M_p,
                      outputRepr->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void FOOLElimination::reportProcessed(std::string inputRepr, std::string outputRepr) {
  if (inputRepr != outputRepr) {
    /**
     * If show_fool is set to off, the string representations of the input
     * and the output of process() may in some cases coincide, despite the
     * input and the output being different. Example: $term{$true} and
     * $true. In order to avoid misleading log messages with the input and
     * the output seeming the same, we will not log such processings at
     * all. Setting show_fool to on, however, will display everything.
     */
    std::cout << "[PP] FOOL in:  " << inputRepr  << endl;
    std::cout << "[PP] FOOL out: " << outputRepr << endl;
  }
}